

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prep.h
# Opt level: O3

void __thiscall
Professor::Professor
          (Professor *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *data)

{
  string *psVar1;
  char *pcVar2;
  long *plVar3;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *pvVar4;
  uint *puVar5;
  long lVar6;
  undefined8 uVar7;
  uint uVar8;
  uint uVar9;
  char **__endptr;
  char *local_80;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *local_78;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_70;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_68;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_60;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_58;
  string *local_50;
  string *local_48;
  string *local_40;
  string *local_38;
  
  psVar1 = &this->name;
  local_58 = &(this->name).field_2;
  (this->name)._M_dataplus._M_p = (pointer)local_58;
  (this->name)._M_string_length = 0;
  (this->name).field_2._M_local_buf[0] = '\0';
  local_40 = (string *)&this->surname;
  local_60 = &(this->surname).field_2;
  (this->surname)._M_dataplus._M_p = (pointer)local_60;
  (this->surname)._M_string_length = 0;
  (this->surname).field_2._M_local_buf[0] = '\0';
  local_48 = (string *)&this->middle_name;
  local_68 = &(this->middle_name).field_2;
  (this->middle_name)._M_dataplus._M_p = (pointer)local_68;
  (this->middle_name)._M_string_length = 0;
  (this->middle_name).field_2._M_local_buf[0] = '\0';
  local_50 = &this->link;
  local_70 = &(this->link).field_2;
  (this->link)._M_dataplus._M_p = (pointer)local_70;
  (this->link)._M_string_length = 0;
  (this->link).field_2._M_local_buf[0] = '\0';
  pcVar2 = (((data->
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             )._M_impl.super__Vector_impl_data._M_start)->_M_dataplus)._M_p;
  local_78 = data;
  puVar5 = (uint *)__errno_location();
  uVar8 = *puVar5;
  *puVar5 = 0;
  lVar6 = strtol(pcVar2,&local_80,10);
  pvVar4 = local_78;
  local_38 = psVar1;
  if (local_80 == pcVar2) {
    std::__throw_invalid_argument("stoi");
LAB_00112ccf:
    std::__throw_out_of_range("stoi");
LAB_00112cdb:
    std::__throw_invalid_argument("stoi");
LAB_00112ce7:
    std::__throw_out_of_range("stoi");
LAB_00112cf3:
    std::__throw_invalid_argument("stoi");
LAB_00112cff:
    std::__throw_out_of_range("stoi");
LAB_00112d0b:
    std::__throw_invalid_argument("stoi");
LAB_00112d17:
    std::__throw_out_of_range("stoi");
LAB_00112d23:
    __endptr = &local_80;
    std::__throw_invalid_argument("stoi");
LAB_00112d2f:
    uVar8 = (uint)__endptr;
    std::__throw_out_of_range("stoi");
  }
  else {
    if (((int)lVar6 != lVar6) || (*puVar5 == 0x22)) goto LAB_00112ccf;
    if (*puVar5 == 0) {
      *puVar5 = uVar8;
    }
    this->prep_id = (int)lVar6;
    std::__cxx11::string::_M_assign((string *)psVar1);
    std::__cxx11::string::_M_assign(local_40);
    std::__cxx11::string::_M_assign(local_48);
    pcVar2 = (pvVar4->
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             )._M_impl.super__Vector_impl_data._M_start[4]._M_dataplus._M_p;
    uVar8 = *puVar5;
    *puVar5 = 0;
    lVar6 = strtol(pcVar2,&local_80,10);
    if (local_80 == pcVar2) goto LAB_00112cdb;
    if ((lVar6 - 0x80000000U < 0xffffffff00000000) || (uVar9 = *puVar5, uVar9 == 0x22))
    goto LAB_00112ce7;
    if (uVar9 == 0) {
      *puVar5 = uVar8;
      uVar9 = uVar8;
    }
    this->knowledge = (double)(int)lVar6;
    pcVar2 = (local_78->
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             )._M_impl.super__Vector_impl_data._M_start[5]._M_dataplus._M_p;
    *puVar5 = 0;
    lVar6 = strtol(pcVar2,&local_80,10);
    if (local_80 == pcVar2) goto LAB_00112cf3;
    if ((lVar6 - 0x80000000U < 0xffffffff00000000) || (uVar8 = *puVar5, uVar8 == 0x22))
    goto LAB_00112cff;
    if (uVar8 == 0) {
      *puVar5 = uVar9;
      uVar8 = uVar9;
    }
    this->skill = (double)(int)lVar6;
    pcVar2 = (local_78->
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             )._M_impl.super__Vector_impl_data._M_start[6]._M_dataplus._M_p;
    *puVar5 = 0;
    lVar6 = strtol(pcVar2,&local_80,10);
    pvVar4 = local_78;
    if (local_80 == pcVar2) goto LAB_00112d0b;
    if ((lVar6 - 0x80000000U < 0xffffffff00000000) || (uVar9 = *puVar5, uVar9 == 0x22))
    goto LAB_00112d17;
    if (uVar9 == 0) {
      *puVar5 = uVar8;
      uVar9 = uVar8;
    }
    this->social = (double)(int)lVar6;
    pcVar2 = (local_78->
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             )._M_impl.super__Vector_impl_data._M_start[7]._M_dataplus._M_p;
    *puVar5 = 0;
    __endptr = &local_80;
    lVar6 = strtol(pcVar2,__endptr,10);
    if (local_80 == pcVar2) goto LAB_00112d23;
    if (lVar6 - 0x80000000U < 0xffffffff00000000) goto LAB_00112d2f;
    uVar8 = *puVar5;
    __endptr = (char **)(ulong)uVar8;
    if (uVar8 == 0x22) goto LAB_00112d2f;
    if (uVar8 == 0) {
      *puVar5 = uVar9;
      uVar8 = uVar9;
    }
    this->loyality = (double)(int)lVar6;
    pcVar2 = (pvVar4->
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             )._M_impl.super__Vector_impl_data._M_start[8]._M_dataplus._M_p;
    *puVar5 = 0;
    lVar6 = strtol(pcVar2,&local_80,10);
    if (local_80 != pcVar2) {
      if ((0xfffffffeffffffff < lVar6 - 0x80000000U) && (*puVar5 != 0x22)) {
        if (*puVar5 == 0) {
          *puVar5 = uVar8;
        }
        this->total = (double)(int)lVar6;
        std::__cxx11::string::_M_replace
                  ((ulong)local_50,0,(char *)(this->link)._M_string_length,0x11d0c5);
        return;
      }
      goto LAB_00112d47;
    }
  }
  std::__throw_invalid_argument("stoi");
LAB_00112d47:
  uVar7 = std::__throw_out_of_range("stoi");
  if (*puVar5 == 0) {
    *puVar5 = uVar8;
  }
  plVar3 = (long *)(local_50->_M_dataplus)._M_p;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)plVar3 != local_70) {
    operator_delete(plVar3,local_70->_M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*(long **)local_48 != local_68) {
    operator_delete(*(long **)local_48,local_68->_M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*(long **)local_40 != local_60) {
    operator_delete(*(long **)local_40,local_60->_M_allocated_capacity + 1);
  }
  plVar3 = (long *)(local_38->_M_dataplus)._M_p;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)plVar3 != local_58) {
    operator_delete(plVar3,local_58->_M_allocated_capacity + 1);
  }
  _Unwind_Resume(uVar7);
}

Assistant:

Professor(std::vector<std::string> data) {
        prep_id = std::stoi(data[0]);
        name = data[1];
        surname = data[2];
        middle_name = data[3];
        knowledge = std::stoi(data[4]);
        skill = std::stoi(data[5]);
        social = std::stoi(data[6]);
        loyality = std::stoi(data[7]);
        total = std::stoi(data[8]);
        link = "";

    }